

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID id;
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  pointer pcVar4;
  SPIRVariable *pSVar5;
  SPIRFunction *pSVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  SPIRType *type;
  runtime_error *prVar12;
  undefined8 extraout_RAX;
  Bitset *pBVar13;
  SPIREntryPoint *pSVar14;
  size_type sVar15;
  mapped_type *pmVar16;
  _func_void *p_Var17;
  long *plVar18;
  StorageClass storage_00;
  CompilerMSL *this_00;
  uint32_t auVar19 [2];
  SPIRVariable *pSVar20;
  string flatten_from_ib_mbr_name;
  string mbr_name;
  uint local_1d0;
  StorageClass local_1cc;
  SPIRVariable *local_1c8;
  char local_1b9;
  char local_1b8;
  char local_1b7;
  char local_1b6;
  char local_1b5;
  uint32_t local_1b4;
  uint32_t local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  uint32_t local_1a4;
  string local_1a0;
  undefined1 local_180 [24];
  uint32_t local_168 [2];
  long *local_160;
  long local_158;
  long local_150;
  ulong *local_148;
  char *local_140;
  ulong local_138;
  char cStack_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  undefined5 local_120;
  undefined3 uStack_11b;
  uint local_118;
  undefined1 local_114;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  SPIRFunction *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c0;
  string *local_b8;
  InterfaceBlockMeta *local_b0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_a8;
  string local_a0;
  long *local_80;
  SmallVector<std::function<void_()>,_0UL> *local_78;
  string local_70;
  string local_50;
  
  pSVar20 = var;
  local_1cc = storage;
  local_b8 = ib_var_ref;
  local_f0 = Variant::get<spirv_cross::SPIRFunction>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_1c8 = var;
  local_b0 = meta;
  if (meta->strip_array == true) {
    type = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    type = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar7 = Compiler::is_matrix((Compiler *)this,type);
  bVar8 = Compiler::is_array((Compiler *)this,type);
  if (bVar7) {
    if (bVar8) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "MSL cannot emit arrays-of-matrices in input and output variables.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)local_180);
      *(undefined ***)prVar12 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1b0 = type->columns;
  }
  else {
    local_1b0 = 0;
    if (bVar8) {
      if ((type->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_180._0_8_ = local_180 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,
                   "MSL cannot emit arrays-of-arrays in input and output variables.","");
        ::std::runtime_error::runtime_error(prVar12,(string *)local_180);
        *(undefined ***)prVar12 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1b0 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
    }
  }
  pSVar5 = local_1c8;
  bVar7 = Compiler::is_builtin_variable((Compiler *)this,local_1c8);
  local_1b4 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationBuiltIn);
  local_1b5 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationFlat);
  local_1b6 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,
                         DecorationNoPerspective);
  local_1b7 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationCentroid);
  local_1b8 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationSample);
  storage_00 = local_1cc;
  if (type->pointer != true) goto LAB_0025ad2b;
  do {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
LAB_0025ad2b:
    bVar8 = Compiler::is_array((Compiler *)this,type);
  } while ((bVar8) || (bVar8 = Compiler::is_matrix((Compiler *)this,type), bVar8));
  if (bVar7) {
    id.id = (local_1c8->super_IVariant).self.id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((string *)local_180,this,(ulong)local_1b4,7);
    Compiler::set_name((Compiler *)this,id,(string *)local_180);
    storage_00 = local_1cc;
    if ((SPIRVariable *)local_180._0_8_ != (SPIRVariable *)(local_180 + 0x10)) {
      operator_delete((void *)local_180._0_8_);
      storage_00 = local_1cc;
    }
  }
  pSVar6 = local_f0;
  pSVar5 = local_1c8;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_1b9 = local_1b4 == 3 && bVar7;
  if ((local_1b4 == 3 && bVar7) && storage_00 == StorageClassOutput) {
    uVar10 = (uint32_t)
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
    uVar9 = Compiler::get_variable_data_type_id((Compiler *)this,local_1c8);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (&ib_type->member_types,
               (ib_type->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
    sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [sVar2].id = uVar9;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar2 + 1;
    pSVar20 = (SPIRVariable *)0x3;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationBuiltIn,3
              );
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_180,this,3,3);
    ::std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_180);
    if ((SPIRVariable *)local_180._0_8_ != (SPIRVariable *)(local_180 + 0x10)) {
      operator_delete((void *)local_180._0_8_);
    }
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,&local_1a0);
    local_1a8 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    storage_00 = local_1cc;
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_0025b827;
  }
  else {
    if (local_b0->strip_array == false) {
      uVar10 = (local_1c8->super_IVariant).self.id;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                (&local_f0->local_variables,
                 (local_f0->local_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
      sVar2 = (pSVar6->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      (pSVar6->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
      [sVar2].id = uVar10;
      (pSVar6->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
      buffer_size = sVar2 + 1;
      uVar1 = (pSVar5->super_IVariant).self.id;
      SmallVector<unsigned_int,_8UL>::reserve
                (&this->vars_needing_early_declaration,
                 (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size +
                 1);
      sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar1;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
      storage_00 = local_1cc;
    }
    local_1a8 = 0;
  }
  local_1d0 = 0;
  if (local_1b0 != 0) {
    local_a8 = &ib_type->member_types;
    local_c0 = &(this->inputs_by_builtin)._M_h;
    local_78 = &local_f0->fixup_hooks_out;
    local_80 = &local_150;
    local_f0 = (SPIRFunction *)&local_f0->fixup_hooks_in;
    do {
      uVar3 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      local_1a4 = (type->super_IVariant).self.id;
      pBVar13 = Compiler::get_decoration_bitset
                          ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id);
      if (((pBVar13->lower & 0x40000000) == 0) ||
         ((this->msl_options).pad_fragment_output_components != true)) {
        local_1ac = 0;
      }
      else {
        pSVar14 = Compiler::get_entry_point((Compiler *)this);
        local_1ac = 0;
        if ((storage_00 == StorageClassOutput) && (pSVar14->model == ExecutionModelFragment)) {
          uVar10 = Compiler::get_decoration
                             ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id,
                              DecorationLocation);
          uVar9 = get_target_components_for_fragment_location(this,uVar10 + local_1d0);
          uVar1 = type->vecsize;
          uVar10 = uVar9;
          if (uVar1 < uVar9) {
            uVar10 = build_extended_vector_type(this,(type->super_IVariant).self.id,uVar9,Unknown);
            local_1a4 = uVar10;
          }
          local_1ac = CONCAT31((int3)(uVar10 >> 8),uVar1 < uVar9);
          storage_00 = local_1cc;
        }
      }
      uVar10 = Compiler::get_pointee_type_id((Compiler *)this,local_1a4);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                (local_a8,(ib_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                          + 1);
      sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      [sVar2].id = uVar10;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = sVar2 + 1;
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)local_180,&this->super_CompilerGLSL,(local_1c8->super_IVariant).self.id,
                 true);
      join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
                (&local_50,(spirv_cross *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e7de5,
                 (char (*) [2])&local_1d0,(uint *)pSVar20);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (CompilerMSL *)0x2f56ae;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
      ensure_valid_name(&local_a0,this_00,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((SPIRVariable *)local_180._0_8_ != (SPIRVariable *)(local_180 + 0x10)) {
        operator_delete((void *)local_180._0_8_);
      }
      uVar10 = (uint32_t)uVar3;
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,&local_a0);
      pBVar13 = Compiler::get_decoration_bitset
                          ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id);
      if ((pBVar13->lower & 0x40000000) == 0) {
        if ((bVar7) && (bVar8 = Compiler::is_tessellation_shader((Compiler *)this), bVar8)) {
          local_180._0_4_ = local_1b4;
          sVar15 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(local_c0,(key_type *)local_180);
          if (sVar15 != 0) {
            local_180._0_4_ = local_1b4;
            pmVar16 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_c0,(key_type *)local_180);
            uVar9 = local_1d0 + pmVar16->location;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                       DecorationLocation,uVar9);
            mark_location_as_used_by_shader(this,uVar9,type,storage_00);
            goto LAB_0025b2c5;
          }
        }
        if (local_1b9 != '\0') {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                     DecorationBuiltIn,3);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                     DecorationLocation,local_1d0);
        }
      }
      else {
        uVar9 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id,
                           DecorationLocation);
        pSVar20 = local_1c8;
        uVar9 = uVar9 + local_1d0;
        if (storage_00 == StorageClassInput) {
          uVar11 = ensure_correct_input_type
                             (this,*(uint32_t *)&(local_1c8->super_IVariant).field_0xc,uVar9,0);
          *(uint32_t *)&(pSVar20->super_IVariant).field_0xc = uVar11;
          uVar11 = ensure_correct_input_type(this,(type->super_IVariant).self.id,uVar9,0);
          (local_a8->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
          [uVar3 & 0xffffffff].id = uVar11;
          storage_00 = local_1cc;
        }
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                   DecorationLocation,uVar9);
        mark_location_as_used_by_shader(this,uVar9,type,storage_00);
      }
LAB_0025b2c5:
      pBVar13 = Compiler::get_decoration_bitset
                          ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id);
      if ((pBVar13->lower & 0x100000000) != 0) {
        uVar9 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id,DecorationIndex)
        ;
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationIndex
                   ,uVar9);
      }
      if (local_1b5 != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationFlat,
                   0);
      }
      if (local_1b6 != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                   DecorationNoPerspective,0);
      }
      if (local_1b7 != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                   DecorationCentroid,0);
      }
      if (local_1b8 != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                   DecorationSample,0);
      }
      uVar1 = (local_1c8->super_IVariant).self.id;
      pSVar20 = (SPIRVariable *)(ulong)uVar1;
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar10,
                 SPIRVCrossDecorationInterfaceOrigID,uVar1);
      if (local_b0->strip_array == false) {
        if (storage_00 == StorageClassOutput) {
          local_180._0_8_ = local_1c8;
          local_180[8] = (char)local_1ac;
          local_168[0] = local_1a4;
          local_160 = &local_150;
          pcVar4 = (local_b8->_M_dataplus)._M_p;
          local_180._16_8_ = this;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar4,pcVar4 + local_b8->_M_string_length);
          local_140 = &cStack_130;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          local_120 = SUB85(type,0);
          uStack_11b = (undefined3)((ulong)type >> 0x28);
          local_118 = local_1d0;
          local_114 = (undefined1)local_1a8;
          local_110 = &local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_1a0._M_dataplus._M_p,
                     local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
          local_d8 = (code *)0x0;
          pcStack_d0 = (code *)0x0;
          local_e8._M_unused._M_object = (void *)0x0;
          local_e8._8_8_ = 0;
          p_Var17 = (_func_void *)operator_new(0x90);
          *(undefined4 *)(p_Var17 + 0xc) = local_180._12_4_;
          *(undefined4 *)(p_Var17 + 0x10) = local_180._16_4_;
          *(undefined4 *)(p_Var17 + 0x14) = local_180._20_4_;
          *(uint32_t *)(p_Var17 + 0x18) = local_168[0];
          *(undefined4 *)p_Var17 = local_180._0_4_;
          *(undefined4 *)(p_Var17 + 4) = local_180._4_4_;
          *(undefined4 *)(p_Var17 + 8) = local_180._8_4_;
          *(undefined4 *)(p_Var17 + 0xc) = local_180._12_4_;
          *(_func_void **)(p_Var17 + 0x20) = p_Var17 + 0x30;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var17 + 0x20),local_160,local_158 + (long)local_160);
          storage_00 = local_1cc;
          *(_func_void **)(p_Var17 + 0x40) = p_Var17 + 0x50;
          if (local_140 == &cStack_130) {
            *(ulong *)(p_Var17 + 0x50) = CONCAT71(uStack_12f,cStack_130);
            *(undefined8 *)(p_Var17 + 0x58) = uStack_128;
          }
          else {
            *(char **)(p_Var17 + 0x40) = local_140;
            *(ulong *)(p_Var17 + 0x50) = CONCAT71(uStack_12f,cStack_130);
          }
          *(ulong *)(p_Var17 + 0x48) = local_138;
          local_138 = 0;
          cStack_130 = '\0';
          *(ulong *)(p_Var17 + 0x65) = CONCAT17(local_114,CONCAT43(local_118,uStack_11b));
          *(ulong *)(p_Var17 + 0x60) = CONCAT35(uStack_11b,local_120);
          *(_func_void **)(p_Var17 + 0x70) = p_Var17 + 0x80;
          if (local_110 == &local_100) {
            *(ulong *)(p_Var17 + 0x80) = CONCAT71(uStack_ff,local_100);
            *(undefined8 *)(p_Var17 + 0x88) = uStack_f8;
          }
          else {
            *(undefined1 **)(p_Var17 + 0x70) = local_110;
            *(ulong *)(p_Var17 + 0x80) = CONCAT71(uStack_ff,local_100);
          }
          *(undefined8 *)(p_Var17 + 0x78) = local_108;
          local_108 = 0;
          local_100 = 0;
          pcStack_d0 = ::std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2045:42)>
                       ::_M_invoke;
          local_d8 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2045:42)>
                     ::_M_manager;
          local_140 = &cStack_130;
          local_110 = &local_100;
          local_e8._M_unused._0_8_ = (undefined8)p_Var17;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (local_78,(function<void_()> *)&local_e8);
          if (local_d8 != (code *)0x0) {
            (*local_d8)(&local_e8,&local_e8,__destroy_functor);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110);
          }
          if (local_140 != &cStack_130) {
            operator_delete(local_140);
          }
          plVar18 = &local_150;
          auVar19 = (uint32_t  [2])local_160;
        }
        else {
          if (storage_00 != StorageClassInput) goto LAB_0025b7f9;
          local_180._0_8_ = local_1c8;
          local_180._16_4_ = local_1d0;
          local_168 = (uint32_t  [2])&local_158;
          pcVar4 = (local_b8->_M_dataplus)._M_p;
          local_180._8_8_ = this;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_168,pcVar4,pcVar4 + local_b8->_M_string_length);
          local_148 = &local_138;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          local_d8 = (code *)0x0;
          pcStack_d0 = (code *)0x0;
          local_e8._M_unused._M_object = (void *)0x0;
          local_e8._8_8_ = 0;
          p_Var17 = (_func_void *)operator_new(0x58);
          *(undefined4 *)(p_Var17 + 0x10) = local_180._16_4_;
          *(undefined4 *)p_Var17 = local_180._0_4_;
          *(undefined4 *)(p_Var17 + 4) = local_180._4_4_;
          *(undefined4 *)(p_Var17 + 8) = local_180._8_4_;
          *(undefined4 *)(p_Var17 + 0xc) = local_180._12_4_;
          *(_func_void **)(p_Var17 + 0x18) = p_Var17 + 0x28;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var17 + 0x18),local_168,(long)local_160 + (long)local_168);
          *(_func_void **)(p_Var17 + 0x38) = p_Var17 + 0x48;
          if (local_148 == &local_138) {
            *(ulong *)(p_Var17 + 0x48) = local_138;
            *(ulong *)(p_Var17 + 0x50) = CONCAT71(uStack_12f,cStack_130);
          }
          else {
            *(ulong **)(p_Var17 + 0x38) = local_148;
            *(ulong *)(p_Var17 + 0x48) = local_138;
          }
          *(char **)(p_Var17 + 0x40) = local_140;
          local_140 = (char *)0x0;
          local_138 = local_138 & 0xffffffffffffff00;
          pcStack_d0 = ::std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2041:9)>
                       ::_M_invoke;
          local_d8 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2041:9)>
                     ::_M_manager;
          local_148 = &local_138;
          local_e8._M_unused._0_8_ = (undefined8)p_Var17;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)local_f0,
                     (function<void_()> *)&local_e8);
          if (local_d8 != (code *)0x0) {
            (*local_d8)(&local_e8,&local_e8,__destroy_functor);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148);
          }
          plVar18 = &local_158;
          auVar19 = local_168;
        }
        if (auVar19 != (uint32_t  [2])plVar18) {
          operator_delete((void *)auVar19);
        }
      }
LAB_0025b7f9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 < local_1b0);
  }
LAB_0025b827:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn);
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && builtin == BuiltInClipDistance)
		{
			// Declare the ClipDistance as [[user(clipN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back(
				    [=, &var]() { statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";"); });
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}